

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O3

int Curl_pipe(curl_socket_t *socks,_Bool nonblocking)

{
  int iVar1;
  
  iVar1 = pipe(socks);
  if (iVar1 == 0) {
    iVar1 = fcntl64(*socks,2,1);
    if ((iVar1 == 0) && (iVar1 = fcntl64(socks[1],2,1), iVar1 == 0)) {
      if (!nonblocking) {
        return 0;
      }
      iVar1 = curlx_nonblock(*socks,1);
      if ((-1 < iVar1) && (iVar1 = curlx_nonblock(socks[1],1), -1 < iVar1)) {
        return 0;
      }
    }
    close(*socks);
    close(socks[1]);
    socks[0] = -1;
    socks[1] = -1;
  }
  return -1;
}

Assistant:

int Curl_pipe(curl_socket_t socks[2], bool nonblocking)
{
  if(pipe(socks))
    return -1;
#ifdef HAVE_FCNTL
  if(fcntl(socks[0], F_SETFD, FD_CLOEXEC) ||
     fcntl(socks[1], F_SETFD, FD_CLOEXEC) ) {
    close(socks[0]);
    close(socks[1]);
    socks[0] = socks[1] = CURL_SOCKET_BAD;
    return -1;
  }
#endif
  if(nonblocking) {
    if(curlx_nonblock(socks[0], TRUE) < 0 ||
       curlx_nonblock(socks[1], TRUE) < 0) {
      close(socks[0]);
      close(socks[1]);
      socks[0] = socks[1] = CURL_SOCKET_BAD;
      return -1;
    }
  }

  return 0;
}